

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg * __thiscall
fmt::v5::internal::
context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>,_wchar_t>
::get_arg(context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>,_wchar_t>
          *this,uint arg_id)

{
  bool bVar1;
  undefined4 in_EDX;
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>,_wchar_t>
  *in_RSI;
  basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
  *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  parse_context(in_RSI);
  bVar1 = basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>::check_arg_id
                    (&in_RSI->parse_context_,(uint)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    do_get_arg((context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>,_wchar_t>
                *)CONCAT44(in_EDX,in_stack_fffffffffffffff0),(uint)((ulong)in_RSI >> 0x20));
  }
  else {
    basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>_>
    ::basic_format_arg(in_RDI);
  }
  return in_RDI;
}

Assistant:

format_arg get_arg(unsigned arg_id) {
    return this->parse_context().check_arg_id(arg_id) ?
      this->do_get_arg(arg_id) : format_arg();
  }